

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_fd_generic_join_mcast.c
# Opt level: O2

int os_fd_generic_join_mcast_recv
              (os_fd *sock,netaddr *multicast,os_interface *os_if,oonf_log_source log_src)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *pcVar4;
  int *piVar5;
  char *pcVar6;
  uint *puVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  netaddr *pnVar11;
  char *pcVar12;
  ip_mreq v4_mreq;
  netaddr_str buf2;
  netaddr_str buf1;
  
  pcVar9 = "*";
  if (os_if != (os_interface *)0x0) {
    pcVar9 = os_if->name;
  }
  if (multicast->_type == '\x02') {
    if (os_if == (os_interface *)0x0) {
      pnVar11 = (netaddr *)&NETADDR_IPV4_ANY;
    }
    else {
      pnVar11 = os_if->if_linklocal_v4;
      if ((pnVar11 == (netaddr *)0x0) || (pnVar11->_type == '\0')) {
        pnVar11 = os_if->if_v4;
      }
    }
    if (((&log_global_mask)[log_src] & 1) != 0) {
      uVar2 = netaddr_to_prefixstring(&buf2,multicast,0);
      uVar3 = netaddr_to_prefixstring(&buf1,pnVar11,0);
      oonf_log(1,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",0x5d,0,0,
               "Socket on interface %s joining receiving multicast %s (src %s)\n",pcVar9,uVar2,uVar3
              );
    }
    netaddr_to_binary(&v4_mreq,multicast,4);
    netaddr_to_binary(&v4_mreq.imr_interface,pnVar11,4);
    iVar1 = setsockopt(sock->fd,0,0x23,&v4_mreq,8);
    if (-1 < iVar1) {
      return 0;
    }
    if (((&log_global_mask)[log_src] & 4) == 0) {
      return -1;
    }
    uVar3 = netaddr_to_prefixstring(&buf1,multicast,0);
    pcVar4 = (char *)netaddr_to_prefixstring(&buf2,pnVar11,0);
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    uVar2 = 100;
    pcVar12 = "Cannot join multicast group %s (src %s) on interface %s: %s (%d)\n";
    pcVar8 = pcVar9;
  }
  else {
    if (os_if == (os_interface *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = os_if->index;
    }
    if (((&log_global_mask)[log_src] & 1) != 0) {
      uVar2 = netaddr_to_prefixstring(&buf2,multicast,0);
      oonf_log(1,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",0x6e,0,0,
               "Socket on interface %s joining receiving multicast %s (if %d)\n",pcVar9,uVar2,uVar10
              );
    }
    netaddr_to_binary(&v4_mreq,multicast,0x10);
    iVar1 = setsockopt(sock->fd,0x29,0x14,&v4_mreq,0x14);
    if (-1 < iVar1) {
      return 0;
    }
    if (((&log_global_mask)[log_src] & 4) == 0) {
      return -1;
    }
    uVar3 = netaddr_to_prefixstring(&buf1,multicast,0);
    puVar7 = (uint *)__errno_location();
    pcVar8 = strerror(*puVar7);
    pcVar6 = (char *)(ulong)*puVar7;
    uVar2 = 0x75;
    pcVar12 = "Cannot join multicast group %s on interface %s: %s (%d)\n";
    pcVar4 = pcVar9;
  }
  oonf_log(4,log_src,"src/base/os_generic/os_fd_generic_join_mcast.c",uVar2,0,0,pcVar12,uVar3,pcVar4
           ,pcVar8,pcVar6);
  return -1;
}

Assistant:

int
os_fd_generic_join_mcast_recv(struct os_fd *sock, const struct netaddr *multicast, const struct os_interface *os_if,
  enum oonf_log_source log_src __attribute__((unused))) {
  struct netaddr_str buf1, buf2;
  struct ip_mreq v4_mreq;
  struct ipv6_mreq v6_mreq;
  const char *ifname = "*";

  if (os_if) {
    ifname = os_if->name;
  }

  if (netaddr_get_address_family(multicast) == AF_INET) {
    const struct netaddr *src;

    if (os_if) {
      if (netaddr_is_unspec(os_if->if_linklocal_v4)) {
        src = os_if->if_v4;
      }
      else {
        src = os_if->if_linklocal_v4;
      }
    }
    else {
      src = &NETADDR_IPV4_ANY;
    }

    OONF_DEBUG(log_src, "Socket on interface %s joining receiving multicast %s (src %s)\n", ifname,
      netaddr_to_string(&buf2, multicast), netaddr_to_string(&buf1, src));

    netaddr_to_binary(&v4_mreq.imr_multiaddr, multicast, 4);
    netaddr_to_binary(&v4_mreq.imr_interface, src, 4);

    if (setsockopt(sock->fd, IPPROTO_IP, IP_ADD_MEMBERSHIP, &v4_mreq, sizeof(v4_mreq)) < 0) {
      OONF_WARN(log_src, "Cannot join multicast group %s (src %s) on interface %s: %s (%d)\n",
        netaddr_to_string(&buf1, multicast), netaddr_to_string(&buf2, src), ifname, strerror(errno), errno);
      return -1;
    }
  }
  else {
    int if_index;

    if_index = os_if == NULL ? 0 : os_if->index;

    OONF_DEBUG(log_src, "Socket on interface %s joining receiving multicast %s (if %d)\n", ifname,
      netaddr_to_string(&buf2, multicast), if_index);

    netaddr_to_binary(&v6_mreq.ipv6mr_multiaddr, multicast, 16);
    v6_mreq.ipv6mr_interface = if_index;

    if (setsockopt(sock->fd, IPPROTO_IPV6, IPV6_JOIN_GROUP, &v6_mreq, sizeof(v6_mreq)) < 0) {
      OONF_WARN(log_src, "Cannot join multicast group %s on interface %s: %s (%d)\n",
        netaddr_to_string(&buf1, multicast), ifname, strerror(errno), errno);
      return -1;
    }
  }
  return 0;
}